

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O3

void * cmGetSource(void *arg,char *name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmSourceFile *this;
  _Base_ptr p_Var2;
  cmCPluginAPISourceFile *pcVar3;
  _Rb_tree_iterator<std::pair<cmSourceFile_*const,_std::unique_ptr<cmCPluginAPISourceFile,_std::default_delete<cmCPluginAPISourceFile>_>_>_>
  _Var4;
  pair<std::_Rb_tree_iterator<std::pair<cmSourceFile_*const,_std::unique_ptr<cmCPluginAPISourceFile,_std::default_delete<cmCPluginAPISourceFile>_>_>_>,_bool>
  pVar5;
  cmSourceFile *rsf;
  _Head_base<0UL,_cmCPluginAPISourceFile_*,_false> local_50;
  string local_48;
  cmSourceFile *local_28;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,name,(allocator<char> *)&local_50);
  this = cmMakefile::GetSource((cmMakefile *)arg,&local_48,Ambiguous);
  paVar1 = &local_48.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (this == (cmSourceFile *)0x0) {
    return (void *)0x0;
  }
  if (cmCPluginAPISourceFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_parent !=
      (_Base_ptr)0x0) {
    _Var4._M_node = &cmCPluginAPISourceFiles._M_t._M_impl.super__Rb_tree_header._M_header;
    p_Var2 = cmCPluginAPISourceFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    do {
      if (*(cmSourceFile **)(p_Var2 + 1) >= this) {
        _Var4._M_node = p_Var2;
      }
      p_Var2 = (&p_Var2->_M_left)[*(cmSourceFile **)(p_Var2 + 1) < this];
    } while (p_Var2 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)_Var4._M_node !=
         &cmCPluginAPISourceFiles._M_t._M_impl.super__Rb_tree_header) &&
       (*(cmSourceFile **)(_Var4._M_node + 1) <= this)) goto LAB_0048fd92;
  }
  local_28 = this;
  pcVar3 = (cmCPluginAPISourceFile *)operator_new(0xb8);
  memset(&(pcVar3->SourceName)._M_string_length,0,0x98);
  (pcVar3->SourceName)._M_dataplus._M_p = (pointer)&(pcVar3->SourceName).field_2;
  (pcVar3->SourceExtension)._M_dataplus._M_p = (pointer)&(pcVar3->SourceExtension).field_2;
  (pcVar3->FullPath)._M_dataplus._M_p = (pointer)&(pcVar3->FullPath).field_2;
  (pcVar3->Depends).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pcVar3->Depends).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pcVar3->Depends).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pcVar3->Properties).Map_._M_h._M_buckets = &(pcVar3->Properties).Map_._M_h._M_single_bucket;
  (pcVar3->Properties).Map_._M_h._M_bucket_count = 1;
  (pcVar3->Properties).Map_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (pcVar3->Properties).Map_._M_h._M_element_count = 0;
  (pcVar3->Properties).Map_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (pcVar3->Properties).Map_._M_h._M_rehash_policy._M_next_resize = 0;
  (pcVar3->Properties).Map_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  pcVar3->RealSourceFile = this;
  local_50._M_head_impl = pcVar3;
  cmSourceFile::ResolveFullPath(this,(string *)0x0,(string *)0x0);
  std::__cxx11::string::_M_assign((string *)&pcVar3->FullPath);
  cmsys::SystemTools::GetFilenameWithoutLastExtension(&local_48,&(local_50._M_head_impl)->FullPath);
  std::__cxx11::string::operator=
            ((string *)&(local_50._M_head_impl)->SourceName,(string *)&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  cmsys::SystemTools::GetFilenameLastExtension(&local_48,&(local_50._M_head_impl)->FullPath);
  std::__cxx11::string::operator=
            ((string *)&(local_50._M_head_impl)->SourceExtension,(string *)&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  pVar5 = std::
          _Rb_tree<cmSourceFile*,std::pair<cmSourceFile*const,std::unique_ptr<cmCPluginAPISourceFile,std::default_delete<cmCPluginAPISourceFile>>>,std::_Select1st<std::pair<cmSourceFile*const,std::unique_ptr<cmCPluginAPISourceFile,std::default_delete<cmCPluginAPISourceFile>>>>,std::less<cmSourceFile*>,std::allocator<std::pair<cmSourceFile*const,std::unique_ptr<cmCPluginAPISourceFile,std::default_delete<cmCPluginAPISourceFile>>>>>
          ::
          _M_emplace_unique<cmSourceFile*&,std::unique_ptr<cmCPluginAPISourceFile,std::default_delete<cmCPluginAPISourceFile>>>
                    ((_Rb_tree<cmSourceFile*,std::pair<cmSourceFile*const,std::unique_ptr<cmCPluginAPISourceFile,std::default_delete<cmCPluginAPISourceFile>>>,std::_Select1st<std::pair<cmSourceFile*const,std::unique_ptr<cmCPluginAPISourceFile,std::default_delete<cmCPluginAPISourceFile>>>>,std::less<cmSourceFile*>,std::allocator<std::pair<cmSourceFile*const,std::unique_ptr<cmCPluginAPISourceFile,std::default_delete<cmCPluginAPISourceFile>>>>>
                      *)&cmCPluginAPISourceFiles,&local_28,
                     (unique_ptr<cmCPluginAPISourceFile,_std::default_delete<cmCPluginAPISourceFile>_>
                      *)&local_50);
  _Var4 = pVar5.first._M_node;
  if (local_50._M_head_impl != (cmCPluginAPISourceFile *)0x0) {
    std::default_delete<cmCPluginAPISourceFile>::operator()
              ((default_delete<cmCPluginAPISourceFile> *)&local_50,local_50._M_head_impl);
  }
LAB_0048fd92:
  return _Var4._M_node[1]._M_parent;
}

Assistant:

static void CCONV* cmGetSource(void* arg, const char* name)
{
  cmMakefile* mf = static_cast<cmMakefile*>(arg);
  if (cmSourceFile* rsf = mf->GetSource(name)) {
    // Lookup the proxy source file object for this source.
    auto i = cmCPluginAPISourceFiles.find(rsf);
    if (i == cmCPluginAPISourceFiles.end()) {
      // Create a proxy source file object for this source.
      auto sf = cm::make_unique<cmCPluginAPISourceFile>();
      sf->RealSourceFile = rsf;
      sf->FullPath = rsf->ResolveFullPath();
      sf->SourceName =
        cmSystemTools::GetFilenameWithoutLastExtension(sf->FullPath);
      sf->SourceExtension =
        cmSystemTools::GetFilenameLastExtension(sf->FullPath);

      // Store the proxy in the map so it can be reused and deleted later.
      i = cmCPluginAPISourceFiles.emplace(rsf, std::move(sf)).first;
    }
    return i->second.get();
  }
  return nullptr;
}